

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O2

ReadThreadsGraph * __thiscall
LongReadsRecruiter::rtg_from_threads
          (ReadThreadsGraph *__return_storage_ptr__,LongReadsRecruiter *this,bool remove_duplicated,
          int min_thread_nodes)

{
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *this_00;
  SequenceDistanceGraph *sdg;
  pointer pvVar1;
  pointer pNVar2;
  vector<NodePosition,_std::allocator<NodePosition>_> *t;
  pointer pvVar3;
  long lVar4;
  pointer pNVar5;
  long lVar6;
  int rid;
  uint64_t i;
  ulong uVar7;
  allocator local_55;
  int local_54;
  vector<unsigned_long,_std::allocator<unsigned_long>_> node_counts;
  
  sdg = this->sdg;
  local_54 = min_thread_nodes;
  std::__cxx11::string::string((string *)&node_counts,"RTG",&local_55);
  ReadThreadsGraph::ReadThreadsGraph(__return_storage_ptr__,sdg,(string *)&node_counts);
  std::__cxx11::string::~string((string *)&node_counts);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&node_counts,
             ((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&local_55);
  pvVar1 = (this->read_threads).
           super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar3 = (this->read_threads).
                super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1) {
    pNVar2 = (pvVar3->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pNVar5 = (pvVar3->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                  super__Vector_impl_data._M_start; pNVar5 != pNVar2; pNVar5 = pNVar5 + 1) {
      lVar4 = pNVar5->node;
      lVar6 = -lVar4;
      if (0 < lVar4) {
        lVar6 = lVar4;
      }
      node_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] =
           node_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6] + 1;
    }
  }
  this_00 = &(__return_storage_ptr__->super_DistanceGraph).links;
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::resize(this_00,(long)node_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)node_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
  lVar4 = 0x18;
  for (uVar7 = 1;
      uVar7 < (ulong)((long)node_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)node_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    std::vector<Link,_std::allocator<Link>_>::reserve
              ((vector<Link,_std::allocator<Link>_> *)
               ((long)&(((this_00->
                         super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                       super__Vector_impl_data + lVar4),
               node_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7] * 2);
    lVar4 = lVar4 + 0x18;
  }
  lVar4 = 0x18;
  for (uVar7 = 1;
      pvVar3 = (this->read_threads).
               super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)(((long)(this->read_threads).
                             super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar7 = uVar7 + 1) {
    ReadThreadsGraph::add_thread
              (__return_storage_ptr__,uVar7,
               (vector<NodePosition,_std::allocator<NodePosition>_> *)
               ((long)&(pvVar3->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                       _M_impl.super__Vector_impl_data + lVar4),remove_duplicated,local_54);
    lVar4 = lVar4 + 0x18;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&node_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

ReadThreadsGraph LongReadsRecruiter::rtg_from_threads(bool remove_duplicated, int min_thread_nodes) {
    ReadThreadsGraph rtg(sdg);
    std::vector<uint64_t> node_counts(sdg.nodes.size());
    for (auto const &t:read_threads) {
        for (auto const &np:t ) ++node_counts[llabs(np.node)];
    }
    rtg.links.resize(node_counts.size());
    for (uint64_t i=1;i<node_counts.size();++i) rtg.links[i].reserve(2*node_counts[i]);
    for (auto rid=1;rid<read_threads.size();++rid) {
        rtg.add_thread(rid,read_threads[rid],remove_duplicated,min_thread_nodes);
    }
    return rtg;
}